

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_Respawn(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  TObjPtr<AActor> *pTVar1;
  byte *pbVar2;
  uint uVar3;
  BYTE *pBVar4;
  undefined8 uVar5;
  double dVar6;
  int iVar7;
  undefined4 extraout_var;
  PClass *pPVar9;
  undefined4 extraout_var_01;
  AActor *pAVar10;
  AActor *this;
  char *pcVar11;
  bool bVar12;
  ulong uVar13;
  DVector3 local_68;
  DVector3 local_48;
  PClass *pPVar8;
  undefined4 extraout_var_00;
  
  pPVar9 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar11 = "(paramnum) < numparam";
    goto LAB_003d7716;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d7706:
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d7716:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xef3,
                  "int AF_AActor_A_Respawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003d74b2;
    pPVar8 = (this->super_DThinker).super_DObject.Class;
    if (pPVar8 == (PClass *)0x0) {
      iVar7 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar8 = (PClass *)CONCAT44(extraout_var,iVar7);
      (this->super_DThinker).super_DObject.Class = pPVar8;
    }
    bVar12 = pPVar8 != (PClass *)0x0;
    if (pPVar8 != pPVar9 && bVar12) {
      do {
        pPVar8 = pPVar8->ParentClass;
        bVar12 = pPVar8 != (PClass *)0x0;
        if (pPVar8 == pPVar9) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    if (!bVar12) {
      pcVar11 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d7716;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003d7706;
LAB_003d74b2:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d7735:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xef4,
                    "int AF_AActor_A_Respawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else if (param[1].field_0.field_3.Type != '\0') {
    pcVar11 = "(param[paramnum]).Type == REGT_INT";
    goto LAB_003d7735;
  }
  uVar3 = param[1].field_0.i;
  local_48.X = (this->__Pos).X;
  local_48.Y = (this->__Pos).Y;
  local_48.Z = (this->__Pos).Z;
  *(byte *)&(this->flags).Value = (byte)(this->flags).Value | 2;
  pPVar9 = (this->super_DThinker).super_DObject.Class;
  if (pPVar9 == (PClass *)0x0) {
    iVar7 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    pPVar9 = (PClass *)CONCAT44(extraout_var_00,iVar7);
    (this->super_DThinker).super_DObject.Class = pPVar9;
  }
  dVar6 = *(double *)(pPVar9->Defaults + 0x180);
  this->radius = *(double *)(pPVar9->Defaults + 0x178);
  this->Height = dVar6;
  AActor::RestoreSpecialPosition(this);
  if ((uVar3 & 4) == 0) {
    local_68.X = (this->__Pos).X;
    local_68.Y = (this->__Pos).Y;
    bVar12 = P_CheckPosition(this,(DVector2 *)&local_68,true);
  }
  else {
    local_68.X = (this->__Pos).X;
    local_68.Y = (this->__Pos).Y;
    local_68.Z = (this->__Pos).Z;
    bVar12 = P_TeleportMove(this,&local_68,true,false);
  }
  if (bVar12 == false) {
    *(byte *)&(this->flags).Value = (byte)(this->flags).Value & 0xfd;
    return 0;
  }
  pPVar9 = (this->super_DThinker).super_DObject.Class;
  if (pPVar9 == (PClass *)0x0) {
    iVar7 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    pPVar9 = (PClass *)CONCAT44(extraout_var_01,iVar7);
    (this->super_DThinker).super_DObject.Class = pPVar9;
  }
  pBVar4 = pPVar9->Defaults;
  this->health = *(int *)(pBVar4 + 0x1fc);
  pTVar1 = &this->target;
  if ((uVar3 & 2) == 0) {
    (pTVar1->field_0).p = (AActor *)0x0;
    (this->lastenemy).field_0.p = (AActor *)0x0;
    (this->LastHeard).field_0.p = (AActor *)0x0;
    goto LAB_003d7614;
  }
  pAVar10 = (pTVar1->field_0).p;
  if (pAVar10 == (AActor *)0x0) {
LAB_003d75d7:
    pAVar10 = (AActor *)0x0;
  }
  else if (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (pTVar1->field_0).p = (AActor *)0x0;
    goto LAB_003d75d7;
  }
  if (pAVar10 == this) {
    (pTVar1->field_0).p = (AActor *)0x0;
  }
  pAVar10 = (this->lastenemy).field_0.p;
  if (pAVar10 == (AActor *)0x0) {
LAB_003d7602:
    pAVar10 = (AActor *)0x0;
  }
  else if (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->lastenemy).field_0.p = (AActor *)0x0;
    goto LAB_003d7602;
  }
  if (pAVar10 == this) {
    (this->lastenemy).field_0.p = (AActor *)0x0;
  }
LAB_003d7614:
  (this->flags).Value = (this->flags).Value & 0x8000000 | *(uint *)(pBVar4 + 0x1bc) & 0xf7ffffff;
  (this->flags2).Value = *(uint *)(pBVar4 + 0x1c0);
  uVar13._0_4_ = this->flags3;
  uVar13._4_4_ = this->flags4;
  uVar13 = uVar13 & 0x180000080 | *(ulong *)(pBVar4 + 0x1c4) & 0xfffffffe7fffff7f;
  this->flags3 = (ActorFlags3)(int)uVar13;
  this->flags4 = (ActorFlags4)(int)(uVar13 >> 0x20);
  uVar5 = *(undefined8 *)(pBVar4 + 0x1cc);
  this->flags5 = (ActorFlags5)(int)uVar5;
  this->flags6 = (ActorFlags6)(int)((ulong)uVar5 >> 0x20);
  (this->flags7).Value = *(uint *)(pBVar4 + 0x1d4);
  AActor::SetState(this,this->SpawnState,false);
  pbVar2 = (byte *)((long)&(this->renderflags).Value + 1);
  *pbVar2 = *pbVar2 & 0x7f;
  if ((uVar3 & 1) != 0) {
    P_SpawnTeleportFog(this,&local_48,true,true);
    local_68.X = (this->__Pos).X;
    local_68.Y = (this->__Pos).Y;
    local_68.Z = (this->__Pos).Z;
    P_SpawnTeleportFog(this,&local_68,false,true);
  }
  if (((this->flags).Value & 0x8400000) == 0x400000) {
    level.total_monsters = level.total_monsters + 1;
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Respawn)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(flags);

	bool oktorespawn = false;
	DVector3 pos = self->Pos();

	self->flags |= MF_SOLID;
	self->Height = self->GetDefault()->Height;
	self->radius = self->GetDefault()->radius;
	self->RestoreSpecialPosition();

	if (flags & RSF_TELEFRAG)
	{
		// [KS] DIE DIE DIE DIE erm *ahem* =)
		oktorespawn = P_TeleportMove(self, self->Pos(), true, false);
	}
	else
	{
		oktorespawn = P_CheckPosition(self, self->Pos(), true);
	}

	if (oktorespawn)
	{
		AActor *defs = self->GetDefault();
		self->health = defs->health;

		// [KS] Don't keep target, because it could be self if the monster committed suicide
		//      ...Actually it's better off an option, so you have better control over monster behavior.
		if (!(flags & RSF_KEEPTARGET))
		{
			self->target = NULL;
			self->LastHeard = NULL;
			self->lastenemy = NULL;
		}
		else
		{
			// Don't attack yourself (Re: "Marine targets itself after suicide")
			if (self->target == self)
				self->target = NULL;
			if (self->lastenemy == self)
				self->lastenemy = NULL;
		}

		self->flags  = (defs->flags & ~MF_FRIENDLY) | (self->flags & MF_FRIENDLY);
		self->flags2 = defs->flags2;
		self->flags3 = (defs->flags3 & ~(MF3_NOSIGHTCHECK | MF3_HUNTPLAYERS)) | (self->flags3 & (MF3_NOSIGHTCHECK | MF3_HUNTPLAYERS));
		self->flags4 = (defs->flags4 & ~MF4_NOHATEPLAYERS) | (self->flags4 & MF4_NOHATEPLAYERS);
		self->flags5 = defs->flags5;
		self->flags6 = defs->flags6;
		self->flags7 = defs->flags7;
		self->SetState (self->SpawnState);
		self->renderflags &= ~RF_INVISIBLE;

		if (flags & RSF_FOG)
		{
			P_SpawnTeleportFog(self, pos, true, true);
			P_SpawnTeleportFog(self, self->Pos(), false, true);
		}
		if (self->CountsAsKill())
		{
			level.total_monsters++;
		}
	}
	else
	{
		self->flags &= ~MF_SOLID;
	}
	return 0;
}